

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimTolerance(ON_Brep *this,ON_BrepTrim *trim,bool bLazy)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  ON_BrepLoop *pOVar5;
  int *piVar6;
  long lVar7;
  ON_Curve *pOVar8;
  ON_Curve *pOVar9;
  ON_Curve *pOVar10;
  double *pdVar11;
  ulong uVar12;
  undefined7 in_register_00000011;
  ulong uVar13;
  int iVar14;
  ON_BrepTrim *pOVar15;
  ON_BrepTrim *this_00;
  double dVar16;
  ON_3dPoint prev_end;
  ON_3dPoint next_start;
  ON_3dPoint this_end;
  ON_3dPoint this_start;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  if ((-(uint)(0.0 <= trim->m_tolerance[0] && 0.0 <= trim->m_tolerance[1]) &
      (uint)CONCAT71(in_register_00000011,bLazy)) == 0) {
    lVar7 = (long)trim->m_li;
    if ((-1 < lVar7) &&
       (trim->m_li <
        (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count)) {
      pOVar5 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
      uVar3 = pOVar5[lVar7].m_ti.m_count;
      uVar12 = 0;
      uVar13 = 0;
      if (0 < (int)uVar3) {
        uVar13 = (ulong)uVar3;
      }
      for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        piVar6 = pOVar5[lVar7].m_ti.m_a;
        if (piVar6[uVar12] == trim->m_trim_index) {
          iVar14 = piVar6[(int)(uVar3 + (int)uVar12 + -1) % (int)uVar3];
          if (-1 < (long)iVar14) {
            uVar3 = piVar6[(long)((int)uVar12 + 1) % (long)(int)uVar3 & 0xffffffff];
            if (((-1 < (int)uVar3) &&
                (uVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_count, iVar14 < (int)uVar4)) &&
               (uVar3 < uVar4)) {
              pOVar15 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                        super_ON_ClassArray<ON_BrepTrim>.m_a;
              this_00 = pOVar15 + iVar14;
              pOVar15 = pOVar15 + uVar3;
              pOVar8 = ON_BrepTrim::TrimCurveOf(this_00);
              pOVar9 = ON_BrepTrim::TrimCurveOf(pOVar15);
              pOVar10 = ON_BrepTrim::TrimCurveOf(trim);
              if (((pOVar9 != (ON_Curve *)0x0) && (pOVar8 != (ON_Curve *)0x0)) &&
                 (pOVar10 != (ON_Curve *)0x0)) {
                ON_Curve::PointAtEnd(&local_90,(ON_Curve *)this_00);
                ON_Curve::PointAtStart(&local_48,(ON_Curve *)trim);
                ON_Curve::PointAtEnd(&local_60,(ON_Curve *)trim);
                ON_Curve::PointAtStart(&local_78,(ON_Curve *)pOVar15);
                for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
                  if (trim->m_tolerance[lVar7] <= 0.0 && trim->m_tolerance[lVar7] != 0.0 || !bLazy)
                  {
                    iVar14 = (int)lVar7;
                    pdVar11 = ON_3dPoint::operator[](&local_90,iVar14);
                    dVar16 = *pdVar11;
                    pdVar11 = ON_3dPoint::operator[](&local_48,iVar14);
                    dVar1 = *pdVar11;
                    pdVar11 = ON_3dPoint::operator[](&local_60,iVar14);
                    dVar2 = *pdVar11;
                    pdVar11 = ON_3dPoint::operator[](&local_78,iVar14);
                    uVar12 = -(ulong)(ABS(dVar2 - *pdVar11) <= ABS(dVar16 - dVar1));
                    dVar16 = (double)(~uVar12 & (ulong)ABS(dVar2 - *pdVar11) |
                                     (ulong)ABS(dVar16 - dVar1) & uVar12);
                    trim->m_tolerance[lVar7] =
                         (double)(-(ulong)(2.3283064365386963e-10 < dVar16) &
                                 (ulong)(dVar16 * 1.001));
                  }
                }
              }
            }
          }
          break;
        }
      }
    }
  }
  return (bool)(-(0.0 <= trim->m_tolerance[1]) & -(0.0 <= trim->m_tolerance[0]) & 1);
}

Assistant:

bool
ON_Brep::SetTrimTolerance( ON_BrepTrim& trim, bool bLazy ) const
{
  // The TL_Brep::SetTrimTolerance override of this virtual function
  // sets ON_BrepTrim::m_tolerance[] correctly.
  double ds, de, d;
  int dir, lti, prev_ti, next_ti;
  if ( trim.m_tolerance[0] < 0.0 || trim.m_tolerance[1] < 0.0 || !bLazy )
  {
    // set trim tolerance
    if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const int loop_trim_count = loop.m_ti.Count();
      for ( lti = 0; lti < loop_trim_count; lti++ )
      {
        if ( loop.m_ti[lti] == trim.m_trim_index )
        {
          prev_ti = loop.m_ti[(lti-1+loop_trim_count)%loop_trim_count];
          next_ti = loop.m_ti[(lti+1)%loop_trim_count];
          if ( prev_ti >= 0 && next_ti >= 0 && prev_ti < m_T.Count() && next_ti < m_T.Count() )
          {
            const ON_BrepTrim& prev_trim = m_T[prev_ti];
            const ON_BrepTrim& next_trim = m_T[next_ti];
            const ON_Curve* prev_c2 = prev_trim.TrimCurveOf();
            const ON_Curve* next_c2 = next_trim.TrimCurveOf();
            const ON_Curve* c2 = trim.TrimCurveOf();
            if ( prev_c2 && c2 && next_c2 )
            {
              ON_3dPoint prev_end = prev_trim.PointAtEnd(); //prev_c2->PointAt( prev_trim.m_t[1] );
              ON_3dPoint this_start = trim.PointAtStart(); //c2->PointAt( trim.m_t[0] );
              ON_3dPoint this_end = trim.PointAtEnd(); // c2->PointAt( trim.m_t[1] );
              ON_3dPoint next_start = next_trim.PointAtStart(); //prev_c2->PointAt( next_trim.m_t[0] );
              for ( dir = 0; dir < 2; dir++ )
              {
                if ( trim.m_tolerance[dir] < 0.0 || !bLazy )
                {
                  ds = fabs(prev_end[dir] - this_start[dir] );
                  de = fabs(this_end[dir] - next_start[dir] );
                  d = (ds >= de) ? ds : de;
                  trim.m_tolerance[dir] = ( d > ON_ZERO_TOLERANCE ) ? 1.001*d : 0.0;
                }
              }
            }
          }
          break;
        }
      }
    }
  }
  return (trim.m_tolerance[0] >= 0.0 && trim.m_tolerance[1] >= 0.0) ? true : false;
}